

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageModule.cpp
# Opt level: O0

Message * __thiscall
ki::protocol::dml::MessageModule::create_message(MessageModule *this,string *message_name)

{
  MessageTemplate *this_00;
  ostream *poVar1;
  value_error *this_01;
  Message *pMVar2;
  string local_1e8 [32];
  ostringstream local_1c8 [8];
  ostringstream oss;
  string local_40 [32];
  MessageTemplate *local_20;
  MessageTemplate *message_template;
  string *message_name_local;
  MessageModule *this_local;
  
  message_template = (MessageTemplate *)message_name;
  message_name_local = (string *)this;
  std::__cxx11::string::string(local_40,(string *)message_name);
  this_00 = get_message_template(this,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  local_20 = this_00;
  if (this_00 == (MessageTemplate *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar1 = std::operator<<((ostream *)local_1c8,"No message exists with name: ");
    std::operator<<(poVar1,(string *)message_name);
    poVar1 = std::operator<<((ostream *)local_1c8,"(service=");
    poVar1 = std::operator<<(poVar1,(string *)&this->m_protocol_type);
    std::operator<<(poVar1,")");
    this_01 = (value_error *)__cxa_allocate_exception(0x18);
    std::__cxx11::ostringstream::str();
    value_error::value_error(this_01,local_1e8,DML_INVALID_MESSAGE_NAME);
    __cxa_throw(this_01,&value_error::typeinfo,value_error::~value_error);
  }
  pMVar2 = MessageTemplate::create_message(this_00);
  return pMVar2;
}

Assistant:

Message *MessageModule::create_message(std::string message_name) const
	{
		auto *message_template = get_message_template(message_name);
		if (!message_template)
		{
			std::ostringstream oss;
			oss << "No message exists with name: " << message_name;
			oss << "(service=" << m_protocol_type << ")";
			throw value_error(oss.str(), value_error::DML_INVALID_MESSAGE_NAME);
		}

		return message_template->create_message();
	}